

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QObject *o)

{
  _func_int **pp_Var1;
  QTextStream *this;
  storage_type *in_RCX;
  long in_RDX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_40,(QDebug *)o);
  if (in_RDX == 0) {
    this = (QTextStream *)o->_vptr_QObject;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"QObject(0x0)";
    QString::fromUtf8(&local_38,(QString *)0xc,ba);
    QTextStream::operator<<(this,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&((QTextStream *)o->_vptr_QObject)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<((QTextStream *)o->_vptr_QObject,' ');
    }
    pp_Var1 = o->_vptr_QObject;
    ((dbg.stream)->ts)._vptr_QTextStream = pp_Var1;
    pp_Var1 = pp_Var1 + 5;
    *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
  }
  else {
    (**(code **)(**(long **)(in_RDX + 8) + 0x18))(*(long **)(in_RDX + 8),o);
    pp_Var1 = o->_vptr_QObject;
    o->_vptr_QObject = (_func_int **)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = pp_Var1;
  }
  QDebugStateSaver::~QDebugStateSaver(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QObject *o)
{
    QDebugStateSaver saver(dbg);
    if (!o)
        return dbg << "QObject(0x0)";

    const QObjectPrivate *d = QObjectPrivate::get(o);
    d->writeToDebugStream(dbg);
    return dbg;
}